

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O3

void acutest_line_indent_(int level)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  
  uVar3 = level * 2;
  if (acutest_tap_ == '\x01') {
    uVar3 = uVar3 - 1;
    putchar(0x23);
  }
  uVar1 = uVar3;
  if (0x10 < (int)uVar3) {
    do {
      printf("%s","                ");
      uVar1 = uVar3 - 0x10;
      bVar2 = 0x20 < uVar3;
      uVar3 = uVar1;
    } while (bVar2);
  }
  printf("%.*s",(ulong)uVar1,"                ");
  return;
}

Assistant:

static void
acutest_line_indent_(int level)
{
    static const char spaces[] = "                ";
    int n = level * 2;

    if(acutest_tap_  &&  n > 0) {
        n--;
        printf("#");
    }

    while(n > 16) {
        printf("%s", spaces);
        n -= 16;
    }
    printf("%.*s", n, spaces);
}